

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableP<tcu::Matrix<float,_2,_2>_>::VariableP
          (VariableP<tcu::Matrix<float,_2,_2>_> *this,Variable<tcu::Matrix<float,_2,_2>_> *ptr)

{
  Variable<tcu::Matrix<float,_2,_2>_> *ptr_local;
  VariableP<tcu::Matrix<float,_2,_2>_> *this_local;
  
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>::
  SharedPtr(&this->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}